

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Point::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Point *this)

{
  uint32_t uVar1;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar2;
  SingleMthdTest *this_00;
  result_type rVar3;
  MthdVtxXy *pMVar4;
  Test *pTVar5;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_179;
  TestOptions *local_178;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_170;
  Test *local_168;
  MthdVtxXy *local_160;
  SingleMthdTest *local_158;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_150;
  undefined1 *local_148;
  long local_140;
  undefined1 local_138 [16];
  undefined1 *local_128;
  long local_120;
  undefined1 local_118 [16];
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  string local_a8;
  string local_88;
  SingleMthdTest *local_68;
  Test *local_60;
  MthdVtxXy *local_58;
  Test *local_50;
  Test *local_48;
  Test *local_40;
  MthdVtxXy *local_38;
  
  local_150 = __return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_170 = &(this->super_Class).rnd;
  local_158 = this_00;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_170);
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"notify","");
  local_178 = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_00,local_178,(uint32_t)rVar3);
  (this_00->super_MthdTest).trapbit = -1;
  (this_00->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  this_00->s_cls = uVar1;
  this_00->s_mthd = 0x104;
  this_00->s_stride = 4;
  this_00->s_num = 1;
  this_00->s_trapbit = -1;
  (this_00->name)._M_dataplus._M_p = (pointer)&(this_00->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&this_00->name,local_c8,local_c8 + local_c0);
  (this_00->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_68 = this_00;
  local_168 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_170);
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"color","");
  pTVar5 = local_168;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_168,local_178,(uint32_t)rVar3);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x304;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_e8,local_e8 + local_e0);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c700;
  local_60 = pTVar5;
  pMVar4 = (MthdVtxXy *)operator_new(0x25958);
  local_160 = pMVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_170);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"point.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar4,local_178,(uint32_t)rVar3,&local_88,-1,(this->super_Class).cls,0x400,0x20,4,5);
  local_58 = pMVar4;
  pTVar5 = (Test *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_170);
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"point32.x","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,local_178,(uint32_t)rVar3);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x480;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 8;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_108,local_108 + local_100);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349e80;
  *(undefined2 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 1;
  local_50 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_170);
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"point32.y","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,local_178,(uint32_t)rVar3);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x484;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 8;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_128,local_128 + local_120);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349f78;
  *(undefined2 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 0x100;
  local_48 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_170);
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"cpoint.color","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,local_178,(uint32_t)rVar3);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x500;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 8;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_148,local_148 + local_140);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c700;
  local_40 = pTVar5;
  pMVar4 = (MthdVtxXy *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_170);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"cpoint.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar4,local_178,(uint32_t)rVar3,&local_a8,-1,(this->super_Class).cls,0x504,0x10,8,5);
  pvVar2 = local_150;
  __l._M_len = 7;
  __l._M_array = &local_68;
  local_38 = pMVar4;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_150,__l,&local_179);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  return pvVar2;
}

Assistant:

std::vector<SingleMthdTest *> Point::mthds() {
	return {
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdSolidColor(opt, rnd(), "color", -1, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "point.xy", -1, cls, 0x400, 0x20, 4, VTX_FIRST | VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "point32.x", -1, cls, 0x480, 0x10, 8, VTX_FIRST | VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "point32.y", -1, cls, 0x484, 0x10, 8, VTX_FIRST | VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "cpoint.color", -1, cls, 0x500, 0x10, 8),
		new MthdVtxXy(opt, rnd(), "cpoint.xy", -1, cls, 0x504, 0x10, 8, VTX_FIRST | VTX_DRAW),
	};
}